

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcb.c
# Opt level: O3

int envy_bios_parse_rdcb(envy_bios *bios)

{
  uint8_t uVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  
  uVar2 = (bios->dcb).offset;
  uVar4 = uVar2 - 1;
  uVar7 = bios->length;
  if (uVar4 < uVar7) {
    puVar3 = bios->data;
    uVar1 = puVar3[uVar4];
    (bios->dcb).rdcb_version = uVar1;
    bVar10 = uVar1 - 0x11;
    if ((bVar10 < 7) && ((0x71U >> (bVar10 & 0x1f) & 1) != 0)) {
      (bios->dcb).rdcb_len = *(uint16_t *)(&DAT_00273e88 + (ulong)bVar10 * 2);
      if (uVar2 - 2 < uVar7) {
        (bios->inputdev).offset = CONCAT11(puVar3[uVar2 - 2],puVar3[uVar2 - 3]);
        uVar4 = 0;
      }
      else {
        (bios->inputdev).offset = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)(uVar2 - 3));
        uVar2 = (bios->dcb).offset;
        uVar7 = bios->length;
        uVar4 = 0xfffffff2;
      }
      uVar6 = (uint)uVar2;
      uVar5 = uVar6 - 5;
      if (uVar5 < uVar7) {
        bVar10 = bios->data[uVar5];
        uVar5 = 0;
      }
      else {
        bVar10 = 0;
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar5);
        uVar6 = (uint)(bios->dcb).offset;
        uVar7 = bios->length;
        uVar5 = 0xfffffff2;
      }
      if (uVar6 - 4 < uVar7) {
        bVar11 = bios->data[uVar6 - 4];
        uVar7 = 0;
      }
      else {
        bVar11 = 0;
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar7 = 0xfffffff2;
      }
      uVar7 = uVar5 | uVar4 | uVar7;
      (bios->dcb).tvdac0_present = bVar10 & 1;
      (bios->dcb).tvdac0_neg = bVar10 >> 1 & 1;
      (bios->dcb).tvdac0_line = bVar11 >> 4;
      (bios->dcb).rdcb_unk04_0 = bVar11 & 0xf;
      (bios->dcb).rdcb_unk05_2 = bVar10 >> 2;
      iVar8 = -6;
      lVar9 = 0x169;
      do {
        uVar4 = (uint)(bios->dcb).offset + iVar8;
        if (uVar4 < bios->length) {
          *(uint8_t *)((long)&bios->data + lVar9) = bios->data[uVar4];
          uVar4 = 0;
        }
        else {
          *(undefined1 *)((long)&bios->data + lVar9) = 0;
          fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          uVar4 = 0xfffffff2;
        }
        uVar7 = uVar7 | uVar4;
        iVar8 = iVar8 + -1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x170);
      if (0x14 < (bios->dcb).rdcb_version) {
        uVar2 = (bios->dcb).offset;
        uVar4 = bios->length;
        if (uVar2 - 0xd < uVar4) {
          (bios->dcb).rdcb_unk0d = bios->data[uVar2 - 0xd];
          uVar5 = 0;
        }
        else {
          (bios->dcb).rdcb_unk0d = '\0';
          fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          uVar2 = (bios->dcb).offset;
          uVar4 = bios->length;
          uVar5 = 0xfffffff2;
        }
        uVar6 = uVar2 - 0xe;
        if (uVar6 < uVar4) {
          (bios->gpio).offset = CONCAT11(bios->data[uVar6],bios->data[uVar2 - 0xf]);
          uVar4 = 0;
        }
        else {
          (bios->gpio).offset = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          uVar4 = 0xfffffff2;
        }
        uVar7 = uVar7 | uVar5 | uVar4;
        iVar8 = -0x10;
        lVar9 = 0x171;
        do {
          uVar4 = (uint)(bios->dcb).offset + iVar8;
          if (uVar4 < bios->length) {
            *(uint8_t *)((long)&bios->data + lVar9) = bios->data[uVar4];
            uVar4 = 0;
          }
          else {
            *(undefined1 *)((long)&bios->data + lVar9) = 0;
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            uVar4 = 0xfffffff2;
          }
          uVar7 = uVar7 | uVar4;
          iVar8 = iVar8 + -1;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x17a);
        if (0x16 < (bios->dcb).rdcb_version) {
          iVar8 = -0x19;
          lVar9 = 0x17a;
          do {
            uVar4 = (uint)(bios->dcb).offset + iVar8;
            if (uVar4 < bios->length) {
              *(uint8_t *)((long)&bios->data + lVar9) = bios->data[uVar4];
              uVar4 = 0;
            }
            else {
              *(undefined1 *)((long)&bios->data + lVar9) = 0;
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
              uVar4 = 0xfffffff2;
            }
            uVar7 = uVar7 | uVar4;
            iVar8 = iVar8 + -1;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x17e);
        }
      }
      iVar8 = -0xe;
      if (uVar7 == 0) {
        uVar7 = (uint)(bios->dcb).rdcb_len;
        envy_bios_block(bios,(bios->dcb).offset - uVar7,uVar7,"RDCB",-1);
        if ((bios->dcb).rdcb_version < 0x16) {
          uVar7 = ((uint)(bios->dcb).offset - (uint)(bios->dcb).rdcb_len) - 0x80;
          bios->odcb_offset = uVar7;
          envy_bios_block(bios,uVar7,0x80,"ODCB",-1);
        }
        (bios->dcb).rdcb_valid = '\x01';
        iVar8 = 0;
      }
    }
    else {
      envy_bios_parse_rdcb_cold_1();
      iVar8 = -0x16;
    }
  }
  else {
    (bios->dcb).rdcb_version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar4);
    iVar8 = -0xe;
  }
  return iVar8;
}

Assistant:

int envy_bios_parse_rdcb (struct envy_bios *bios) {
	struct envy_bios_dcb *dcb = &bios->dcb;
	int err = 0;
	err |= bios_u8(bios, dcb->offset - 1, &dcb->rdcb_version);
	if (err)
		return -EFAULT;
	switch (dcb->rdcb_version) {
		case 0x11:
			dcb->rdcb_len = 0xc;
			break;
		case 0x15:
		case 0x16:
			dcb->rdcb_len = 0x18;
			break;
		case 0x17:
			dcb->rdcb_len = 0x1c;
			break;
		default:
			ENVY_BIOS_ERR("Unknown RDCB table version %d.%d\n", dcb->rdcb_version >> 4, dcb->rdcb_version & 0xf);
			return -EINVAL;
	}
	err |= bios_u16(bios, dcb->offset - 3, &bios->inputdev.offset);
	uint8_t tv0, tv1;
	int j;
	err |= bios_u8(bios, dcb->offset - 5, &tv0);
	err |= bios_u8(bios, dcb->offset - 4, &tv1);
	dcb->tvdac0_present = tv0 & 1;
	dcb->tvdac0_neg = tv0 >> 1 & 1;
	dcb->tvdac0_line = tv1 >> 4;
	dcb->rdcb_unk04_0 = tv1 & 0xf;
	dcb->rdcb_unk05_2 = tv0 >> 2;
	for (j = 0; j < 7; j++)
		err |= bios_u8(bios, dcb->offset - 6 - j, &dcb->rdcb_unk06[j]);
	if (dcb->rdcb_version >= 0x15) {
		err |= bios_u8(bios, dcb->offset - 13, &dcb->rdcb_unk0d);
		err |= bios_u16(bios, dcb->offset - 15, &bios->gpio.offset);
		for (j = 0; j < 9; j++)
			err |= bios_u8(bios, dcb->offset - 16 - j, &dcb->rdcb_unk10[j]);
	}
	if (dcb->rdcb_version >= 0x17) {
		for (j = 9; j < 13; j++)
			err |= bios_u8(bios, dcb->offset - 16 - j, &dcb->rdcb_unk10[j]);
	}
	if (err)
		return -EFAULT;
	envy_bios_block(bios, dcb->offset - dcb->rdcb_len, dcb->rdcb_len, "RDCB", -1);
	if (dcb->rdcb_version < 0x16) {
		bios->odcb_offset = dcb->offset - dcb->rdcb_len - 0x80;
		envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
	}
	dcb->rdcb_valid = 1;
	return 0;
}